

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

fio_str_info_s * fiobj_data_read2ch(fio_str_info_s *__return_storage_ptr__,FIOBJ io,uint8_t token)

{
  size_t sVar1;
  int *piVar2;
  uint8_t token_local;
  FIOBJ io_local;
  
  if ((io == 0) || (sVar1 = fiobj_type_is(io,FIOBJ_T_DATA), sVar1 == 0)) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    memset(__return_storage_ptr__,0,0x18);
    return __return_storage_ptr__;
  }
  if (*(int *)(io + 0x30) == -2) {
    fiobj_data_read2ch_slice(__return_storage_ptr__,io,token);
    return __return_storage_ptr__;
  }
  if (*(int *)(io + 0x30) == -1) {
    fiobj_data_read2ch_str(__return_storage_ptr__,io,token);
    return __return_storage_ptr__;
  }
  fiobj_data_read2ch_file(__return_storage_ptr__,io,token);
  return __return_storage_ptr__;
}

Assistant:

fio_str_info_s fiobj_data_read2ch(FIOBJ io, uint8_t token) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA)) {
    errno = EFAULT;
    return (fio_str_info_s){.data = NULL, .len = 0};
  }
  switch (obj2io(io)->fd) {
  case -1:
    return fiobj_data_read2ch_str(io, token);
    break;
  case -2:
    return fiobj_data_read2ch_slice(io, token);
    break;
  default:
    return fiobj_data_read2ch_file(io, token);
  }
}